

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioCOMConstructWithCustomAllocatorEXT
                   (FAudio **ppFAudio,uint8_t version,FAudioMallocFunc customMalloc,
                   FAudioFreeFunc customFree,FAudioReallocFunc customRealloc)

{
  long lVar1;
  FAudioMutex pvVar2;
  undefined8 in_RCX;
  code *in_RDX;
  undefined1 in_SIL;
  long *in_RDI;
  undefined8 in_R8;
  
  FAudio_PlatformAddRef();
  lVar1 = (*in_RDX)(0xe8);
  *in_RDI = lVar1;
  SDL_memset(*in_RDI,0,0xe8);
  *(undefined1 *)*in_RDI = in_SIL;
  pvVar2 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*in_RDI + 0x30) = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*in_RDI + 0x38) = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*in_RDI + 0x40) = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*in_RDI + 0x48) = pvVar2;
  *(code **)(*in_RDI + 0xb8) = in_RDX;
  *(undefined8 *)(*in_RDI + 0xc0) = in_RCX;
  *(undefined8 *)(*in_RDI + 200) = in_R8;
  *(undefined4 *)(*in_RDI + 4) = 1;
  return 0;
}

Assistant:

uint32_t FAudioCOMConstructWithCustomAllocatorEXT(
	FAudio **ppFAudio,
	uint8_t version,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
#ifndef FAUDIO_DISABLE_DEBUGCONFIGURATION
	FAudioDebugConfiguration debugInit = {0};
#endif /* FAUDIO_DISABLE_DEBUGCONFIGURATION */
	FAudio_PlatformAddRef();
	*ppFAudio = (FAudio*) customMalloc(sizeof(FAudio));
	FAudio_zero(*ppFAudio, sizeof(FAudio));
	(*ppFAudio)->version = version;
#ifndef FAUDIO_DISABLE_DEBUGCONFIGURATION
	FAudio_SetDebugConfiguration(*ppFAudio, &debugInit, NULL);
#endif /* FAUDIO_DISABLE_DEBUGCONFIGURATION */
	(*ppFAudio)->sourceLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE((*ppFAudio), (*ppFAudio)->sourceLock)
	(*ppFAudio)->submixLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE((*ppFAudio), (*ppFAudio)->submixLock)
	(*ppFAudio)->callbackLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE((*ppFAudio), (*ppFAudio)->callbackLock)
	(*ppFAudio)->operationLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE((*ppFAudio), (*ppFAudio)->operationLock)
	(*ppFAudio)->pMalloc = customMalloc;
	(*ppFAudio)->pFree = customFree;
	(*ppFAudio)->pRealloc = customRealloc;
	(*ppFAudio)->refcount = 1;
	return 0;
}